

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineStatusOutput.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_b874e::CommandLineStatusOutputImpl::close
          (CommandLineStatusOutputImpl *this,int __fd)

{
  int in_EAX;
  
  if (this->hasOutput == true) {
    fputc(10,(FILE *)this->fp);
    in_EAX = fflush((FILE *)this->fp);
  }
  this->fp = (FILE *)0x0;
  this->isClosed = true;
  return in_EAX;
}

Assistant:

bool close(std::string* error_out) {
    if (hasOutput) {
      fprintf(fp, "\n");
      fflush(fp);
    }

    fp = nullptr;
    isClosed = true; // Don't allow re-opening.
    return true;
  }